

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxgx_compress.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *path;
  bool bVar1;
  int iVar2;
  string_view local_78;
  undefined1 local_68 [8];
  string compressed;
  string raw;
  
  if (argc == 3) {
    path = argv[2];
    raw._M_dataplus._M_p = (pointer)0x0;
    raw._M_string_length._0_1_ = 0;
    compressed.field_2._8_8_ = &raw._M_string_length;
    bVar1 = mg::fs::read_file(argv[1],(string *)((long)&compressed.field_2 + 8));
    iVar2 = -1;
    if (bVar1) {
      compressed._M_dataplus._M_p = (pointer)0x0;
      compressed._M_string_length._0_1_ = 0;
      local_78._M_len = (size_t)raw._M_dataplus._M_p;
      local_78._M_str = (char *)compressed.field_2._8_8_;
      local_68 = (undefined1  [8])&compressed._M_string_length;
      bVar1 = mg::data::nxgx_compress(&local_78,(string *)local_68);
      if (bVar1) {
        bVar1 = mg::fs::write_file(path,(string *)local_68);
        iVar2 = bVar1 - 1;
      }
      else {
        main_cold_2();
      }
      if (local_68 != (undefined1  [8])&compressed._M_string_length) {
        operator_delete((void *)local_68,
                        CONCAT71(compressed._M_string_length._1_7_,
                                 (undefined1)compressed._M_string_length) + 1);
      }
    }
    if ((size_type *)compressed.field_2._8_8_ != &raw._M_string_length) {
      operator_delete((void *)compressed.field_2._8_8_,
                      CONCAT71(raw._M_string_length._1_7_,(undefined1)raw._M_string_length) + 1);
    }
  }
  else {
    main_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s input output\n", argv[0]);
    return -1;
  }

  // Name args
  const char *input_file = argv[1];
  const char *output_file = argv[2];

  // Read raw input data
  std::string raw;
  if (!mg::fs::read_file(input_file, raw)) {
    return -1;
  }

  // Compress
  std::string compressed;
  if (!mg::data::nxgx_compress(raw, compressed)) {
    fprintf(stderr, "Failed to compress\n");
    return -1;
  }

  // Write
  if (!mg::fs::write_file(output_file, compressed)) {
    return -1;
  }

  return 0;
}